

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicInputIBase::Run(BasicInputIBase *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  GLuint GVar5;
  void *__s;
  long lVar6;
  undefined **ppuVar7;
  int *piVar8;
  char *format;
  value_type_conflict5 *__val;
  ulong uVar9;
  byte bVar10;
  undefined8 uStack_468;
  undefined8 uStack_460;
  ulong uStack_458;
  ulong uStack_450;
  char *glsl_vs;
  UVec4 dataui [32];
  IVec4 datai [32];
  
  bVar10 = 0;
  glsl_vs = 
  "#version 430 core\nlayout(location = 0) in ivec4 vs_in_attribi[8];\nlayout(location = 8) in uvec4 vs_in_attribui[8];\nout StageData {\n  ivec4 attribi[8];\n  uvec4 attribui[8];\n} vs_out;\nvoid main() {\n  for (int i = 0; i < vs_in_attribi.length(); ++i) {\n    vs_out.attribi[i] = vs_in_attribi[i];\n  }\n  for (int i = 0; i < vs_in_attribui.length(); ++i) {\n    vs_out.attribui[i] = vs_in_attribui[i];\n  }\n}"
  ;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  uStack_450 = 0xa0219f;
  GVar5 = glu::CallLogWrapper::glCreateProgram(this_00);
  this->m_po = GVar5;
  uStack_450 = 0xa021af;
  GVar5 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  uStack_450 = 0xa021c6;
  glu::CallLogWrapper::glShaderSource(this_00,GVar5,1,&glsl_vs,(GLint *)0x0);
  uStack_450 = 0xa021d0;
  glu::CallLogWrapper::glCompileShader(this_00,GVar5);
  uStack_450 = 0xa021dd;
  glu::CallLogWrapper::glAttachShader(this_00,this->m_po,GVar5);
  uStack_450 = 0xa021e7;
  glu::CallLogWrapper::glDeleteShader(this_00,GVar5);
  lVar6 = 0x10;
  ppuVar7 = &PTR_anon_var_dwarf_64f6e2_020e8b30;
  piVar8 = datai[0].m_data;
  for (; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(undefined **)piVar8 = *ppuVar7;
    ppuVar7 = ppuVar7 + (ulong)bVar10 * -2 + 1;
    piVar8 = piVar8 + (ulong)bVar10 * 0xfffffffffffffffc + 2;
  }
  uStack_450 = 0xa0221a;
  glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,this->m_po,0x10,(GLchar **)datai,0x8c8c);
  uStack_450 = 0xa02225;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_po);
  uStack_450 = 0xa02230;
  bVar4 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_po);
  lVar6 = -1;
  if (bVar4) {
    uStack_450 = 0xa0224b;
    __s = operator_new(0x400);
    uStack_450 = 0xa0225d;
    memset(__s,0,0x400);
    uStack_450 = 0xa0226f;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_xfbo);
    uStack_450 = 0xa0228a;
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x400,__s,0x88ea);
    uStack_450 = 0xa02297;
    operator_delete(__s,0x400);
    uStack_450 = 0xa022a4;
    glu::CallLogWrapper::glEnable(this_00,0x8c89);
    uStack_450 = 0xa022af;
    glu::CallLogWrapper::glUseProgram(this_00,this->m_po);
    uVar9 = 0;
    uStack_450 = 0xa022bc;
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    uStack_450 = 0xa022db;
    glu::CallLogWrapper::glDrawArraysInstancedBaseInstance
              (this_00,0,0,2,this->instance_count,this->base_instance);
    uStack_450 = 0xa022e3;
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    uStack_450 = 0xa022f2;
    memset(datai,0,0x200);
    uStack_450 = 0xa0230f;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0,0x80,datai);
    uStack_450 = 0xa02330;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x100,0x80,datai + 8);
    uStack_450 = 0xa0234b;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x200,0x80,datai + 0x10);
    uStack_450 = 0xa0236d;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x300,0x80,datai + 0x18);
    uStack_450 = 0xa02381;
    memset(dataui,0,0x200);
    uStack_450 = 0xa0239b;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x80,0x80,dataui);
    uStack_450 = 0xa023bb;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x180,0x80,dataui + 8);
    uStack_450 = 0xa023d8;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x280,0x80,dataui + 0x10);
    uStack_450 = 0xa023f5;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0x380,0x80,dataui + 0x18);
    bVar4 = true;
    lVar6 = 0x30;
    do {
      uVar1 = *(uint *)((long)this->expected_datai[0].m_data + lVar6 + -0x2c);
      uVar2 = *(uint *)((long)this->expected_datai[0].m_data + lVar6 + -0x28);
      uVar3 = *(uint *)((long)this->expected_datai[0].m_data + lVar6 + -0x24);
      if ((((*(int *)((long)&(((BasicInputIBase *)(this->expected_datai + -3))->
                             super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                             _vptr_GLWrapper + lVar6) != *(int *)((long)dataui[0x1d].m_data + lVar6)
            ) || (uVar1 != *(uint *)((long)dataui[0x1d].m_data + lVar6 + 4))) ||
          (uVar2 != *(uint *)((long)dataui[0x1d].m_data + lVar6 + 8))) ||
         (uVar3 != *(uint *)((long)dataui[0x1d].m_data + lVar6 + 0xc))) {
        format = "Datai is: %d %d %d %d, datai should be: %d %d %d %d, index is: %d.\n";
LAB_00a024b7:
        uStack_458 = (ulong)uVar3;
        uStack_460 = (ulong)uVar2;
        uStack_468 = (ulong)uVar1;
        uStack_450 = uVar9;
        anon_unknown_0::Output(format);
        goto LAB_00a024ca;
      }
      uVar1 = *(uint *)((long)this->expected_dataui[0].m_data + lVar6 + -0x2c);
      uVar2 = *(uint *)((long)this->expected_dataui[0].m_data + lVar6 + -0x28);
      uVar3 = *(uint *)((long)this->expected_dataui[0].m_data + lVar6 + -0x24);
      if (((*(int *)((long)((IVec4 *)(this->expected_dataui + -3))->m_data + lVar6) !=
            *(int *)((long)&uStack_468 + lVar6)) ||
          (uVar1 != *(uint *)((long)&uStack_468 + lVar6 + 4))) ||
         ((uVar2 != *(uint *)((long)&uStack_460 + lVar6) ||
          (uVar3 != *(uint *)((long)&uStack_460 + lVar6 + 4))))) {
        format = "Dataui is: %u %u %u %u, dataui should be: %u %u %u %u, index is: %d.\n";
        goto LAB_00a024b7;
      }
      bVar4 = uVar9 < 0x1f;
      uVar9 = uVar9 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar9 != 0x20);
    bVar4 = false;
LAB_00a024ca:
    lVar6 = -(ulong)bVar4;
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			"#version 430 core" NL "layout(location = 0) in ivec4 vs_in_attribi[8];" NL
			"layout(location = 8) in uvec4 vs_in_attribui[8];" NL "out StageData {" NL "  ivec4 attribi[8];" NL
			"  uvec4 attribui[8];" NL "} vs_out;" NL "void main() {" NL
			"  for (int i = 0; i < vs_in_attribi.length(); ++i) {" NL "    vs_out.attribi[i] = vs_in_attribi[i];" NL
			"  }" NL "  for (int i = 0; i < vs_in_attribui.length(); ++i) {" NL
			"    vs_out.attribui[i] = vs_in_attribui[i];" NL "  }" NL "}";
		m_po = glCreateProgram();
		{
			const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glCompileShader(sh);
			glAttachShader(m_po, sh);
			glDeleteShader(sh);
		}
		{
			const GLchar* const v[16] = { "StageData.attribi[0]",  "StageData.attribi[1]",  "StageData.attribi[2]",
										  "StageData.attribi[3]",  "StageData.attribi[4]",  "StageData.attribi[5]",
										  "StageData.attribi[6]",  "StageData.attribi[7]",  "StageData.attribui[0]",
										  "StageData.attribui[1]", "StageData.attribui[2]", "StageData.attribui[3]",
										  "StageData.attribui[4]", "StageData.attribui[5]", "StageData.attribui[6]",
										  "StageData.attribui[7]" };
			glTransformFeedbackVaryings(m_po, 16, v, GL_INTERLEAVED_ATTRIBS);
		}
		glLinkProgram(m_po);
		if (!CheckProgram(m_po))
			return ERROR;

		{
			std::vector<GLubyte> zero(64 * 16);
			glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_xfbo);
			glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, (GLsizeiptr)zero.size(), &zero[0], GL_DYNAMIC_COPY);
		}

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_po);
		glBeginTransformFeedback(GL_POINTS);
		glDrawArraysInstancedBaseInstance(GL_POINTS, 0, 2, instance_count, base_instance);
		glEndTransformFeedback();

		IVec4 datai[32];
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0 * 16 * 8, 16 * 8, &datai[0]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 2 * 16 * 8, 16 * 8, &datai[8]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 4 * 16 * 8, 16 * 8, &datai[16]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 6 * 16 * 8, 16 * 8, &datai[24]);
		UVec4 dataui[32];
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 1 * 16 * 8, 16 * 8, &dataui[0]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 3 * 16 * 8, 16 * 8, &dataui[8]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 5 * 16 * 8, 16 * 8, &dataui[16]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 7 * 16 * 8, 16 * 8, &dataui[24]);

		for (int i = 0; i < 32; ++i)
		{
			if (!IsEqual(expected_datai[i], datai[i]))
			{
				Output("Datai is: %d %d %d %d, datai should be: %d %d %d %d, index is: %d.\n", datai[i][0], datai[i][1],
					   datai[i][2], datai[i][3], expected_datai[i][0], expected_datai[i][1], expected_datai[i][2],
					   expected_datai[i][3], i);
				return ERROR;
			}
			if (!IsEqual(expected_dataui[i], dataui[i]))
			{
				Output("Dataui is: %u %u %u %u, dataui should be: %u %u %u %u, index is: %d.\n", dataui[i][0],
					   dataui[i][1], dataui[i][2], dataui[i][3], expected_dataui[i][0], expected_dataui[i][1],
					   expected_dataui[i][2], expected_dataui[i][3], i);
				return ERROR;
			}
		}
		return NO_ERROR;
	}